

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O2

void __thiscall
graphics101::ShaderProgram::setUniform
          (ShaderProgram *this,string *name,
          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
          *value)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  use(this);
  uVar1 = anon_unknown.dwarf_fb8a3::location(this->m_program,name);
  uVar3 = *(long *)(value + 8) - *(long *)value;
  lVar2 = 0;
  if (uVar3 != 0) {
    lVar2 = *(long *)value;
  }
  (*gl3wProcs.ptr[0x214])((ulong)uVar1,uVar3 >> 4,lVar2,gl3wProcs.ptr[0x214]);
  return;
}

Assistant:

void ShaderProgram::setUniform( const std::string& name, const std::vector< vec4 >& value ) {
    use();
    bind_uniform( location( m_program, name ), value );
}